

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_79::Input::consumeWhitespace(Input *this)

{
  size_t sVar1;
  Input *this_00;
  byte bVar2;
  
  sVar1 = (this->wrapped).size_;
  while ((((sVar1 != 0 &&
           (this_00 = (Input *)(this->wrapped).ptr, *(char *)&(this_00->wrapped).ptr != '\0')) &&
          (bVar2 = nextChar(this_00), bVar2 < 0x21)) &&
         ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0))) {
    advance(this,1);
    sVar1 = (this->wrapped).size_;
  }
  return;
}

Assistant:

kj::ArrayPtr<const char> consumeWhile(Predicate&& predicate) {
    auto originalPos = wrapped.begin();
    while (!exhausted() && predicate(nextChar())) { advance(); }

    return kj::arrayPtr(originalPos, wrapped.begin());
  }